

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseDefaultAssignment
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location,
          FileDescriptorProto *containing_file)

{
  string *psVar1;
  bool bVar2;
  FieldDescriptorProto_Type FVar3;
  int iVar4;
  uint uVar5;
  Token *pTVar6;
  AlphaNum *a;
  AlphaNum *a_00;
  protobuf *this_00;
  allocator local_209;
  string local_208;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  string local_1a0;
  double local_180;
  double value;
  string local_148;
  unsigned_long local_128;
  uint64_t value_2;
  string local_118;
  unsigned_long local_f8;
  uint64_t max_value_1;
  string local_c0;
  unsigned_long local_a0;
  uint64_t value_1;
  uint64_t max_value;
  string *local_88;
  string *default_value;
  LocationRecorder location;
  allocator local_51;
  string local_50;
  FileDescriptorProto *local_30;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *field_location_local;
  FieldDescriptorProto *field_local;
  Parser *this_local;
  
  local_30 = containing_file;
  containing_file_local = (FileDescriptorProto *)field_location;
  field_location_local = (LocationRecorder *)field;
  field_local = (FieldDescriptorProto *)this;
  bVar2 = FieldDescriptorProto::has_default_value(field);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"Already set option \"default\".",&local_51);
    AddError(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    FieldDescriptorProto::clear_default_value((FieldDescriptorProto *)field_location_local);
  }
  bVar2 = Consume(this,"default");
  if (!bVar2) {
    this_local._7_1_ = 0;
    goto LAB_006381c2;
  }
  bVar2 = Consume(this,"=");
  if (!bVar2) {
    this_local._7_1_ = 0;
    goto LAB_006381c2;
  }
  LocationRecorder::LocationRecorder
            ((LocationRecorder *)&default_value,(LocationRecorder *)containing_file_local,7);
  LocationRecorder::RecordLegacyLocation
            ((LocationRecorder *)&default_value,(Message *)field_location_local,DEFAULT_VALUE);
  local_88 = FieldDescriptorProto::mutable_default_value_abi_cxx11_
                       ((FieldDescriptorProto *)field_location_local);
  bVar2 = FieldDescriptorProto::has_type((FieldDescriptorProto *)field_location_local);
  if (bVar2) {
    FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)field_location_local);
    switch(FVar3) {
    case FieldDescriptorProto_Type_TYPE_DOUBLE:
    case FieldDescriptorProto_Type_TYPE_FLOAT:
      bVar2 = TryConsume(this,"-");
      if (bVar2) {
        std::__cxx11::string::append((char *)local_88);
      }
      this_00 = (protobuf *)&local_180;
      bVar2 = ConsumeNumber(this,(double *)this_00,"Expected number.");
      psVar1 = local_88;
      if (bVar2) {
        SimpleDtoa_abi_cxx11_(&local_1a0,this_00,local_180);
        std::__cxx11::string::append((string *)psVar1);
        std::__cxx11::string::~string((string *)&local_1a0);
        goto switchD_00637aa6_default;
      }
      this_local._7_1_ = 0;
      break;
    case FieldDescriptorProto_Type_TYPE_INT64:
    case FieldDescriptorProto_Type_TYPE_INT32:
    case FieldDescriptorProto_Type_TYPE_SFIXED32:
    case FieldDescriptorProto_Type_TYPE_SFIXED64:
    case FieldDescriptorProto_Type_TYPE_SINT32:
    case FieldDescriptorProto_Type_TYPE_SINT64:
      value_1 = std::numeric_limits<long>::max();
      FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)field_location_local);
      if (((FVar3 == FieldDescriptorProto_Type_TYPE_INT32) ||
          (FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)field_location_local),
          FVar3 == FieldDescriptorProto_Type_TYPE_SINT32)) ||
         (FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)field_location_local),
         FVar3 == FieldDescriptorProto_Type_TYPE_SFIXED32)) {
        iVar4 = std::numeric_limits<int>::max();
        value_1 = (uint64_t)iVar4;
      }
      bVar2 = TryConsume(this,"-");
      if (bVar2) {
        std::__cxx11::string::append((char *)local_88);
        value_1 = value_1 + 1;
      }
      bVar2 = ConsumeInteger64(this,value_1,&local_a0,"Expected integer for field default value.");
      psVar1 = local_88;
      if (bVar2) {
        strings::AlphaNum::AlphaNum((AlphaNum *)&max_value_1,local_a0);
        StrCat_abi_cxx11_(&local_c0,(protobuf *)&max_value_1,a);
        std::__cxx11::string::append((string *)psVar1);
        std::__cxx11::string::~string((string *)&local_c0);
        goto switchD_00637aa6_default;
      }
      this_local._7_1_ = 0;
      break;
    case FieldDescriptorProto_Type_TYPE_UINT64:
    case FieldDescriptorProto_Type_TYPE_FIXED64:
    case FieldDescriptorProto_Type_TYPE_FIXED32:
    case FieldDescriptorProto_Type_TYPE_UINT32:
      local_f8 = std::numeric_limits<unsigned_long>::max();
      FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)field_location_local);
      if ((FVar3 == FieldDescriptorProto_Type_TYPE_UINT32) ||
         (FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)field_location_local),
         FVar3 == FieldDescriptorProto_Type_TYPE_FIXED32)) {
        uVar5 = std::numeric_limits<unsigned_int>::max();
        local_f8 = (unsigned_long)uVar5;
      }
      bVar2 = TryConsume(this,"-");
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_118,"Unsigned field can\'t have negative default value.",
                   (allocator *)((long)&value_2 + 7));
        AddError(this,&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator((allocator<char> *)((long)&value_2 + 7));
      }
      bVar2 = ConsumeInteger64(this,local_f8,&local_128,"Expected integer for field default value.")
      ;
      psVar1 = local_88;
      if (bVar2) {
        strings::AlphaNum::AlphaNum((AlphaNum *)&value,local_128);
        StrCat_abi_cxx11_(&local_148,(protobuf *)&value,a_00);
        std::__cxx11::string::append((string *)psVar1);
        std::__cxx11::string::~string((string *)&local_148);
        goto switchD_00637aa6_default;
      }
      this_local._7_1_ = 0;
      break;
    case FieldDescriptorProto_Type_TYPE_BOOL:
      bVar2 = TryConsume(this,"true");
      if (bVar2) {
        std::__cxx11::string::assign((char *)local_88);
      }
      else {
        bVar2 = TryConsume(this,"false");
        if (!bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_1c0,"Expected \"true\" or \"false\".",&local_1c1);
          AddError(this,&local_1c0);
          std::__cxx11::string::~string((string *)&local_1c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
          this_local._7_1_ = 0;
          break;
        }
        std::__cxx11::string::assign((char *)local_88);
      }
    default:
switchD_00637aa6_default:
      this_local._7_1_ = 1;
      break;
    case FieldDescriptorProto_Type_TYPE_STRING:
      bVar2 = ConsumeString(this,local_88,"Expected string for field default value.");
      if (bVar2) goto switchD_00637aa6_default;
      this_local._7_1_ = 0;
      break;
    case FieldDescriptorProto_Type_TYPE_GROUP:
    case FieldDescriptorProto_Type_TYPE_MESSAGE:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_208,"Messages can\'t have default values.",&local_209);
      AddError(this,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
      this_local._7_1_ = 0;
      break;
    case FieldDescriptorProto_Type_TYPE_BYTES:
      bVar2 = ConsumeString(this,local_88,"Expected string.");
      if (bVar2) {
        CEscape(&local_1e8,local_88);
        std::__cxx11::string::operator=((string *)local_88,(string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        goto switchD_00637aa6_default;
      }
      this_local._7_1_ = 0;
      break;
    case FieldDescriptorProto_Type_TYPE_ENUM:
      bVar2 = ConsumeIdentifier(this,local_88,"Expected enum identifier for field default value.");
      if (bVar2) goto switchD_00637aa6_default;
      this_local._7_1_ = 0;
    }
  }
  else {
    pTVar6 = io::Tokenizer::current(this->input_);
    std::__cxx11::string::operator=((string *)local_88,(string *)&pTVar6->text);
    io::Tokenizer::Next(this->input_);
    this_local._7_1_ = 1;
  }
  max_value._4_4_ = 1;
  LocationRecorder::~LocationRecorder((LocationRecorder *)&default_value);
LAB_006381c2:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseDefaultAssignment(
    FieldDescriptorProto* field, const LocationRecorder& field_location,
    const FileDescriptorProto* containing_file) {
  if (field->has_default_value()) {
    AddError("Already set option \"default\".");
    field->clear_default_value();
  }

  DO(Consume("default"));
  DO(Consume("="));

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kDefaultValueFieldNumber);
  location.RecordLegacyLocation(field,
                                DescriptorPool::ErrorCollector::DEFAULT_VALUE);
  std::string* default_value = field->mutable_default_value();

  if (!field->has_type()) {
    // The field has a type name, but we don't know if it is a message or an
    // enum yet. (If it were a primitive type, |field| would have a type set
    // already.) In this case, simply take the current string as the default
    // value; we will catch the error later if it is not a valid enum value.
    // (N.B. that we do not check whether the current token is an identifier:
    // doing so throws strange errors when the user mistypes a primitive
    // typename and we assume it's an enum. E.g.: "optional int foo = 1 [default
    // = 42]". In such a case the fundamental error is really that "int" is not
    // a type, not that "42" is not an identifier. See b/12533582.)
    *default_value = input_->current().text;
    input_->Next();
    return true;
  }

  switch (field->type()) {
    case FieldDescriptorProto::TYPE_INT32:
    case FieldDescriptorProto::TYPE_INT64:
    case FieldDescriptorProto::TYPE_SINT32:
    case FieldDescriptorProto::TYPE_SINT64:
    case FieldDescriptorProto::TYPE_SFIXED32:
    case FieldDescriptorProto::TYPE_SFIXED64: {
      uint64_t max_value = std::numeric_limits<int64_t>::max();
      if (field->type() == FieldDescriptorProto::TYPE_INT32 ||
          field->type() == FieldDescriptorProto::TYPE_SINT32 ||
          field->type() == FieldDescriptorProto::TYPE_SFIXED32) {
        max_value = std::numeric_limits<int32_t>::max();
      }

      // These types can be negative.
      if (TryConsume("-")) {
        default_value->append("-");
        // Two's complement always has one more negative value than positive.
        ++max_value;
      }
      // Parse the integer to verify that it is not out-of-range.
      uint64_t value;
      DO(ConsumeInteger64(max_value, &value,
                          "Expected integer for field default value."));
      // And stringify it again.
      default_value->append(StrCat(value));
      break;
    }

    case FieldDescriptorProto::TYPE_UINT32:
    case FieldDescriptorProto::TYPE_UINT64:
    case FieldDescriptorProto::TYPE_FIXED32:
    case FieldDescriptorProto::TYPE_FIXED64: {
      uint64_t max_value = std::numeric_limits<uint64_t>::max();
      if (field->type() == FieldDescriptorProto::TYPE_UINT32 ||
          field->type() == FieldDescriptorProto::TYPE_FIXED32) {
        max_value = std::numeric_limits<uint32_t>::max();
      }

      // Numeric, not negative.
      if (TryConsume("-")) {
        AddError("Unsigned field can't have negative default value.");
      }
      // Parse the integer to verify that it is not out-of-range.
      uint64_t value;
      DO(ConsumeInteger64(max_value, &value,
                          "Expected integer for field default value."));
      // And stringify it again.
      default_value->append(StrCat(value));
      break;
    }

    case FieldDescriptorProto::TYPE_FLOAT:
    case FieldDescriptorProto::TYPE_DOUBLE:
      // These types can be negative.
      if (TryConsume("-")) {
        default_value->append("-");
      }
      // Parse the integer because we have to convert hex integers to decimal
      // floats.
      double value;
      DO(ConsumeNumber(&value, "Expected number."));
      // And stringify it again.
      default_value->append(SimpleDtoa(value));
      break;

    case FieldDescriptorProto::TYPE_BOOL:
      if (TryConsume("true")) {
        default_value->assign("true");
      } else if (TryConsume("false")) {
        default_value->assign("false");
      } else {
        AddError("Expected \"true\" or \"false\".");
        return false;
      }
      break;

    case FieldDescriptorProto::TYPE_STRING:
      // Note: When file option java_string_check_utf8 is true, if a
      // non-string representation (eg byte[]) is later supported, it must
      // be checked for UTF-8-ness.
      DO(ConsumeString(default_value,
                       "Expected string for field default "
                       "value."));
      break;

    case FieldDescriptorProto::TYPE_BYTES:
      DO(ConsumeString(default_value, "Expected string."));
      *default_value = CEscape(*default_value);
      break;

    case FieldDescriptorProto::TYPE_ENUM:
      DO(ConsumeIdentifier(default_value,
                           "Expected enum identifier for field "
                           "default value."));
      break;

    case FieldDescriptorProto::TYPE_MESSAGE:
    case FieldDescriptorProto::TYPE_GROUP:
      AddError("Messages can't have default values.");
      return false;
  }

  return true;
}